

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::TestBody(NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Arena *pAVar3;
  char *message;
  char *in_R9;
  pointer pcVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_310;
  internal local_308 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  AssertHelper local_2f8;
  string local_2f0;
  undefined1 local_2d0 [528];
  ArenaStringPtr local_c0;
  ArenaStringPtr local_b8 [7];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 local_40;
  undefined8 local_3c;
  
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)local_2d0,(Arena *)0x0);
  output = &(this->
            super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).value_;
  local_308[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_2d0,output);
  local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_308[0]) {
    local_2f8.data_._0_4_ = 0;
    pcVar4 = (this->
             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).value_._M_dataplus._M_p;
    paVar1 = &local_2f0.field_2;
    local_2f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f0,pcVar4,
               pcVar4 + (this->
                        super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).value_._M_string_length);
    local_310._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_2f0._M_string_length;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_308,"0","this->GetOutput().size()",(int *)&local_2f8,
               (unsigned_long *)&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if (local_308[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_2f0);
      if (local_300 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_300->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_310,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x455,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_310,(Message *)&local_2f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_2f0._M_dataplus._M_p + 8))();
      }
    }
    if (local_300 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_300,local_300);
    }
    local_b8[6].tagged_ptr_.ptr_ = (TaggedStringPtr)(void *)0x0;
    _uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    uStack_48 = 0.0;
    local_40 = false;
    local_2d0._16_4_ = local_2d0._16_4_ | 0x1fff01;
    pAVar3 = (Arena *)local_2d0._8_8_;
    if ((local_2d0._8_8_ & 1) != 0) {
      pAVar3 = *(Arena **)(local_2d0._8_8_ & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)(local_2d0 + 0x208),(string_view)(ZEXT816(0x10f75f1) << 0x40),
               pAVar3);
    local_2d0._16_4_ = local_2d0._16_4_ | 2;
    pAVar3 = (Arena *)local_2d0._8_8_;
    if ((local_2d0._8_8_ & 1) != 0) {
      pAVar3 = *(Arena **)(local_2d0._8_8_ & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set
              (&local_c0,(string_view)(ZEXT816(0x10f75f1) << 0x40),pAVar3);
    local_3c = 0;
    local_2d0._16_4_ = local_2d0._16_4_ | 0x600004;
    if ((local_2d0._8_8_ & 1) != 0) {
      local_2d0._8_8_ = *(undefined8 *)(local_2d0._8_8_ & 0xfffffffffffffffe);
    }
    pcVar4 = anon_var_dwarf_a22956 + 5;
    protobuf::internal::ArenaStringPtr::Set
              (local_b8,(string_view)(ZEXT816(0x10f75f1) << 0x40),(Arena *)local_2d0._8_8_);
    local_308[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_2d0,output);
    local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_308[0]) {
      local_2f8.data_._0_4_ = 0;
      pcVar2 = (this->
               super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).value_._M_dataplus._M_p;
      local_2f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f0,pcVar2,
                 pcVar2 + (this->
                          super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).value_._M_string_length);
      local_310._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_2f0._M_string_length;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (local_308,"0","this->GetOutput().size()",(int *)&local_2f8,
                 (unsigned_long *)&local_310);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if (local_308[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_2f0);
        if (local_300 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = (local_300->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_310,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x46c,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_310,(Message *)&local_2f0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_2f0._M_dataplus._M_p + 8))();
        }
      }
      if (local_300 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_300,local_300);
      }
      uStack_80 = 1;
      local_2d0._16_4_ = local_2d0._16_4_ | 0x200;
      local_308[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_2d0,output);
      local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_308[0]) {
        local_2f8.data_._0_4_ = 2;
        pcVar4 = (this->
                 super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).value_._M_dataplus._M_p;
        local_2f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,pcVar4,
                   pcVar4 + (this->
                            super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).value_._M_string_length);
        local_310._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_2f0._M_string_length;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  (local_308,"2","this->GetOutput().size()",(int *)&local_2f8,
                   (unsigned_long *)&local_310);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_308[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_2f0);
          if (local_300 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar4 = (local_300->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_310,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x470,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_310,(Message *)&local_2f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_2f0._M_dataplus._M_p + 8))();
          }
        }
        if (local_300 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_300,local_300);
        }
        pcVar4 = (this->
                 super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).value_._M_dataplus._M_p;
        local_2f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,pcVar4,
                   pcVar4 + (this->
                            super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).value_._M_string_length);
        testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                  (local_308,"\"\\x08\\x01\"","this->GetOutput()",(char (*) [3])0x11355aa,&local_2f0
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_308[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_2f0);
          if (local_300 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = anon_var_dwarf_a22956 + 5;
          }
          else {
            message = (local_300->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_310,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x471,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_310,(Message *)&local_2f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_2f0._M_dataplus._M_p + 8))();
          }
        }
        if (local_300 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_300,local_300);
        }
        _uStack_80 = _uStack_80 & 0xffffffff00000000;
        local_2d0._16_4_ = local_2d0._16_4_ | 0x200;
        local_308[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_2d0,output);
        local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_308[0]) {
          local_2f8.data_._0_4_ = 0;
          pcVar4 = (this->
                   super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).value_._M_dataplus._M_p;
          local_2f0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f0,pcVar4,
                     pcVar4 + (this->
                              super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).value_._M_string_length);
          local_310._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_2f0._M_string_length;
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    (local_308,"0","this->GetOutput().size()",(int *)&local_2f8,
                     (unsigned_long *)&local_310);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if (local_308[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_2f0);
            if (local_300 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = anon_var_dwarf_a22956 + 5;
            }
            else {
              pcVar4 = (local_300->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_310,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                       ,0x475,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_310,(Message *)&local_2f0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_2f0._M_dataplus._M_p + 8))();
            }
          }
          goto joined_r0x008bfa96;
        }
        testing::Message::Message((Message *)&local_310);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2f0,local_308,(AssertionResult *)"TestSerialize(message, &output_sink)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x474,local_2f0._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_310);
      }
      else {
        testing::Message::Message((Message *)&local_310);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2f0,local_308,(AssertionResult *)"TestSerialize(message, &output_sink)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x46f,local_2f0._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_310);
      }
    }
    else {
      testing::Message::Message((Message *)&local_310);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2f0,local_308,(AssertionResult *)"TestSerialize(message, &output_sink)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x46b,local_2f0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_310);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar1) {
LAB_008bfa71:
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    testing::Message::Message((Message *)&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,local_308,(AssertionResult *)"TestSerialize(message, &output_sink)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x454,local_2f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) goto LAB_008bfa71;
  }
  if (local_310._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_310._M_head_impl + 8))();
  }
joined_r0x008bfa96:
  if (local_300 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_300,local_300);
  }
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_2d0);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceSerializeTest, DontSerializeDefaultValuesTest) {
  // check that serialized data contains only non-zero numeric fields/non-empty
  // string/byte fields.
  TestAllTypes message;
  TypeParam& output_sink = this->GetOutputSinkRef();

  // All default values -> no output.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());

  // Zero values -> still no output.
  message.set_optional_int32(0);
  message.set_optional_int64(0);
  message.set_optional_uint32(0);
  message.set_optional_uint64(0);
  message.set_optional_sint32(0);
  message.set_optional_sint64(0);
  message.set_optional_fixed32(0);
  message.set_optional_fixed64(0);
  message.set_optional_sfixed32(0);
  message.set_optional_sfixed64(0);
  message.set_optional_float(0);
  message.set_optional_double(0);
  message.set_optional_bool(false);
  message.set_optional_string("");
  message.set_optional_bytes("");
  message.set_optional_nested_enum(TestAllTypes::FOO);  // first enum entry
  message.set_optional_foreign_enum(FOREIGN_FOO);       // first enum entry
  message.set_optional_string_piece("");

  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());

  message.set_optional_int32(1);
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(2, this->GetOutput().size());
  EXPECT_EQ("\x08\x01", this->GetOutput());

  message.set_optional_int32(0);
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());
}